

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O1

TopLevelEvalFunctionBodyResolveInfo * __thiscall
TTD::EventLog::AddEvalFunction
          (EventLog *this,FunctionBody *fb,ModuleID moduleId,char16 *source,uint32 sourceLen,
          uint32 grfscr,bool registerDocument,BOOL isIndirect,BOOL strictMode)

{
  uint32 uVar1;
  uint32 uVar2;
  uint32 uVar3;
  uint uVar4;
  TopLevelEvalFunctionBodyResolveInfo *fbInfo;
  
  fbInfo = UnorderedArrayList<TTD::NSSnapValues::TopLevelEvalFunctionBodyResolveInfo,_128UL>::
           NextOpenEntry(&this->m_evalTopLevelScripts);
  uVar1 = UnorderedArrayList<TTD::NSSnapValues::TopLevelScriptLoadFunctionBodyResolveInfo,_512UL>::
          Count(&this->m_loadedTopLevelScripts);
  uVar2 = UnorderedArrayList<TTD::NSSnapValues::TopLevelNewFunctionBodyResolveInfo,_128UL>::Count
                    (&this->m_newFunctionTopLevelScripts);
  uVar3 = UnorderedArrayList<TTD::NSSnapValues::TopLevelEvalFunctionBodyResolveInfo,_128UL>::Count
                    (&this->m_evalTopLevelScripts);
  NSSnapValues::ExtractTopLevelEvalFunctionBodyInfo
            (fbInfo,fb,uVar1 + uVar2 + uVar3,moduleId,source,sourceLen,grfscr,registerDocument,
             isIndirect,strictMode,&this->m_miscSlabAllocator);
  uVar4 = ((fb->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
          m_sourceInfoId + 1;
  if (uVar4 < this->m_sourceInfoCount) {
    uVar4 = this->m_sourceInfoCount;
  }
  this->m_sourceInfoCount = uVar4;
  return fbInfo;
}

Assistant:

const NSSnapValues::TopLevelEvalFunctionBodyResolveInfo* EventLog::AddEvalFunction(Js::FunctionBody* fb, Js::ModuleID moduleId, const char16* source, uint32 sourceLen, uint32 grfscr, bool registerDocument, BOOL isIndirect, BOOL strictMode)
    {
        NSSnapValues::TopLevelEvalFunctionBodyResolveInfo* fbInfo = this->m_evalTopLevelScripts.NextOpenEntry();
        uint32 fCount = (this->m_loadedTopLevelScripts.Count() + this->m_newFunctionTopLevelScripts.Count() + this->m_evalTopLevelScripts.Count());

        NSSnapValues::ExtractTopLevelEvalFunctionBodyInfo(fbInfo, fb, fCount, moduleId, source, sourceLen, grfscr, registerDocument, isIndirect, strictMode, this->m_miscSlabAllocator);
        this->m_sourceInfoCount = max(this->m_sourceInfoCount, fb->GetUtf8SourceInfo()->GetSourceInfoId() + 1);

        return fbInfo;
    }